

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O3

void __thiscall qpdf::Tokenizer::inLiteral(Tokenizer *this,char ch)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  token_type_e tVar4;
  
  bVar2 = isDelimiter(this,ch);
  if (bVar2) {
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
    psVar1 = &this->raw_val;
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    tVar4 = tt_bool;
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)psVar1);
        tVar4 = (uint)(iVar3 != 0) * 2 + tt_null;
      }
    }
    this->type = tVar4;
  }
  return;
}

Assistant:

void
Tokenizer::inLiteral(char ch)
{
    if (isDelimiter(ch)) {
        // A C-locale whitespace character or delimiter terminates token.  It is important to unread
        // the whitespace character even though it is ignored since it may be the newline after a
        // stream keyword.  Removing it here could make the stream-reading code break on some files,
        // though not on any files in the test suite as of this writing.

        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
        type = (raw_val == "true") || (raw_val == "false")
            ? tt::tt_bool
            : (raw_val == "null" ? tt::tt_null : tt::tt_word);
    }
}